

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah_mb.cpp
# Opt level: O1

void __thiscall
embree::avx::BVHNBuilderMBlurSAHGrid<4>::buildMultiSegment
          (BVHNBuilderMBlurSAHGrid<4> *this,size_t numPrimitives)

{
  undefined8 uVar1;
  Scene *pSVar2;
  SubGridBuildData *pSVar3;
  long lVar4;
  float fVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  PrimInfoMB pinfo;
  BVHNodeRecordMB4D<embree::NodeRefPtr<4>_> root;
  mvector<PrimRefMB> local_1a8;
  undefined8 local_180;
  undefined8 uStack_178;
  long lStack_170;
  ulong uStack_168;
  ulong local_160;
  undefined4 local_158;
  float fStack_154;
  undefined1 local_150;
  size_t local_148;
  Scene *local_140;
  BVH *pBStack_138;
  SubGridBuildData *local_130;
  undefined **local_128;
  Scene *local_120;
  PrimInfoMB local_118;
  NodeRef local_88 [2];
  LBBox3fa local_78;
  
  lVar7 = *(long *)&(this->scene->super_AccelN).field_0x188;
  local_1a8.alloc.device = (MemoryMonitorInterface *)(lVar7 + 0x550);
  if (lVar7 == 0) {
    local_1a8.alloc.device = (MemoryMonitorInterface *)0x0;
  }
  local_1a8.alloc.hugepages = false;
  local_1a8.size_active = 0;
  local_1a8.size_alloced = 0;
  local_1a8.items = (PrimRefMB *)0x0;
  if (numPrimitives != 0) {
    uVar6 = numPrimitives * 0x50;
    (**(local_1a8.alloc.device)->_vptr_MemoryMonitorInterface)(local_1a8.alloc.device,uVar6,0);
    if (uVar6 < 0x1c00000) {
      local_1a8.items = (PrimRefMB *)alignedMalloc(uVar6,0x10);
      local_1a8.size_alloced = numPrimitives;
    }
    else {
      local_1a8.items = (PrimRefMB *)os_malloc(uVar6,&local_1a8.alloc.hugepages);
      local_1a8.size_alloced = numPrimitives;
    }
  }
  local_1a8.size_active = local_1a8.size_alloced;
  createPrimRefArrayMSMBlurGrid
            (&local_118,this,this->scene,&local_1a8,
             &(this->bvh->scene->progressInterface).super_BuildProgressMonitor,
             (BBox1f)0x3f80000000000000);
  if (local_118.object_range._end == local_118.object_range._begin) {
    (*(this->bvh->super_AccelData).super_RefCount._vptr_RefCount[5])();
  }
  else {
    pSVar2 = this->scene;
    pSVar3 = (this->sgrids).items;
    fVar5 = (float)numPrimitives * 1.2 * 0.25 * 88.0;
    uVar6 = (ulong)fVar5;
    sVar8 = (local_118.num_time_segments * 0xe0 >> 4) +
            ((long)(fVar5 - 9.223372e+18) & (long)uVar6 >> 0x3f | uVar6);
    FastAllocator::init_estimate(&this->bvh->alloc,sVar8);
    local_148 = 0x400;
    local_180 = 4;
    uStack_178 = 0x50;
    lStack_170 = 0x3f;
    if (this->sahBlockSize != 0) {
      for (; this->sahBlockSize >> lStack_170 == 0; lStack_170 = lStack_170 + -1) {
      }
    }
    local_160 = this->maxLeafSize;
    uStack_168 = this->minLeafSize;
    if (local_160 <= this->minLeafSize) {
      uStack_168 = local_160;
    }
    auVar9._8_4_ = 0x3f800000;
    auVar9._0_8_ = &DAT_3f8000003f800000;
    auVar9._12_4_ = 0x3f800000;
    uVar1 = vmovlps_avx(auVar9);
    _local_158 = CONCAT44(this->intCost,(int)uVar1);
    local_150 = 0;
    local_148 = FastAllocator::fixSingleThreadThreshold
                          (&this->bvh->alloc,4,0x400,
                           local_118.object_range._end - local_118.object_range._begin,sVar8);
    pBStack_138 = this->bvh;
    local_140 = this->scene;
    lVar4 = *(long *)&(local_140->super_AccelN).field_0x188;
    lVar7 = lVar4 + 0x550;
    if (lVar4 == 0) {
      lVar7 = 0;
    }
    local_130 = (this->sgrids).items;
    local_128 = &PTR_operator___02202970;
    local_120 = (pBStack_138->scene->progressInterface).scene;
    BVHBuilderMSMBlur::
    build<embree::NodeRefPtr<4>,embree::avx::GridRecalculatePrimRef,embree::BVHN<4>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Set,embree::avx::CreateMSMBlurLeafGrid<4>,embree::Scene::BuildProgressMonitorInterface>
              (local_88,(BVHBuilderMSMBlur *)&local_1a8,&local_118,lVar7,pSVar2,pSVar3,
               &pBStack_138->alloc,local_140,pBStack_138,local_130,&local_128,&local_180);
    BVHN<4>::set(this->bvh,local_88[0],&local_78,local_118.num_time_segments);
  }
  sVar8 = local_1a8.size_alloced;
  if (local_1a8.items != (PrimRefMB *)0x0) {
    if (local_1a8.size_alloced * 0x50 < 0x1c00000) {
      alignedFree(local_1a8.items);
    }
    else {
      os_free(local_1a8.items,local_1a8.size_alloced * 0x50,local_1a8.alloc.hugepages);
    }
  }
  if (sVar8 != 0) {
    (**(local_1a8.alloc.device)->_vptr_MemoryMonitorInterface)
              (local_1a8.alloc.device,sVar8 * -0x50,1);
  }
  return;
}

Assistant:

void buildMultiSegment(size_t numPrimitives)
      {
        /* create primref array */
        mvector<PrimRefMB> prims(scene->device,numPrimitives);
        PrimInfoMB pinfo = createPrimRefArrayMSMBlurGrid(scene,prims,bvh->scene->progressInterface);

        /* early out if no valid primitives */
        if (pinfo.size() == 0) { bvh->clear(); return; }



        GridRecalculatePrimRef recalculatePrimRef(scene,sgrids.data());

        /* estimate acceleration structure size */
        const size_t node_bytes = pinfo.num_time_segments*sizeof(AABBNodeMB)/(4*N);
        //FIXME: check leaf_bytes
        //const size_t leaf_bytes = size_t(1.2*Primitive::blocks(pinfo.num_time_segments)*sizeof(SubGridQBVHN<N>));
        const size_t leaf_bytes = size_t(1.2*(float)numPrimitives/N * sizeof(SubGridQBVHN<N>));

        bvh->alloc.init_estimate(node_bytes+leaf_bytes);

        /* settings for BVH build */
        BVHBuilderMSMBlur::Settings settings;
        settings.branchingFactor = N;
        settings.maxDepth = BVH::maxDepth;
        settings.logBlockSize = bsr(sahBlockSize);
        settings.minLeafSize = min(minLeafSize,maxLeafSize);
        settings.maxLeafSize = maxLeafSize;
        settings.travCost = travCost;
        settings.intCost = intCost;
        settings.singleLeafTimeSegment = false; 
        settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,pinfo.size(),node_bytes+leaf_bytes);
        
        /* build hierarchy */
        auto root =
          BVHBuilderMSMBlur::build<NodeRef>(prims,pinfo,scene->device,
                                            recalculatePrimRef,
                                            typename BVH::CreateAlloc(bvh),
                                            typename BVH::AABBNodeMB4D::Create(),
                                            typename BVH::AABBNodeMB4D::Set(),
                                            CreateMSMBlurLeafGrid<N>(scene,bvh,sgrids.data()),
                                            bvh->scene->progressInterface,
                                            settings);
        bvh->set(root.ref,root.lbounds,pinfo.num_time_segments);
      }